

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeColsCost(Highs *this,HighsInt num_set_entries,HighsInt *set,double *cost)

{
  HighsLogOptions *log_options;
  bool bVar1;
  HighsInt create_error;
  HighsStatus HVar2;
  allocator local_1d1;
  vector<int,_std::allocator<int>_> local_set;
  vector<double,_std::allocator<double>_> local_cost;
  string local_1a0;
  string local_180;
  string local_160;
  HighsIndexCollection index_collection;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  if (num_set_entries == 0) {
    return kOk;
  }
  std::__cxx11::string::string((string *)&local_160,"column costs",(allocator *)&index_collection);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar1 = doubleUserDataNotNull(log_options,cost,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  if (bVar1) {
    return kError;
  }
  clearDerivedModelProperties(this);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_cost,cost,cost + num_set_entries,
             (allocator_type *)&index_collection);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_set,set,set + num_set_entries,
             (allocator_type *)&index_collection);
  sortSetData(num_set_entries,&local_set,cost,(double *)0x0,(double *)0x0,
              local_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,(double *)0x0,(double *)0x0);
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  create_error = create(&index_collection,num_set_entries,
                        local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
  if (create_error == 0) {
    HVar2 = changeCostsInterface
                      (this,&index_collection,
                       local_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    HighsLogOptions::HighsLogOptions(&local_f0,log_options);
    std::__cxx11::string::string((string *)&local_1a0,"changeCosts",&local_1d1);
    HVar2 = interpretCallStatus(&local_f0,HVar2,kOk,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
    if (HVar2 != kError) {
      HVar2 = returnFromHighs(this,HVar2);
      goto LAB_0023859b;
    }
  }
  else {
    HighsLogOptions::HighsLogOptions(&local_90,log_options);
    std::__cxx11::string::string((string *)&local_180,"changeColsCost",(allocator *)&local_1a0);
    analyseSetCreateError
              (&local_90,&local_180,create_error,true,num_set_entries,
               local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
    std::__cxx11::string::~string((string *)&local_180);
    std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  }
  HVar2 = kError;
LAB_0023859b:
  HighsIndexCollection::~HighsIndexCollection(&index_collection);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_set.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_cost.super__Vector_base<double,_std::allocator<double>_>);
  return HVar2;
}

Assistant:

HighsStatus Highs::changeColsCost(const HighsInt num_set_entries,
                                  const HighsInt* set, const double* cost) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  // Check for NULL data in "set" version of changeColsCost since
  // values are sorted with set
  if (doubleUserDataNotNull(options_.log_options, cost, "column costs"))
    return HighsStatus::kError;
  clearDerivedModelProperties();
  // Ensure that the set and data are in ascending order
  std::vector<double> local_cost{cost, cost + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, cost, NULL, NULL, local_cost.data(),
              NULL, NULL);
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsCost",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeCostsInterface(index_collection, local_cost.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeCosts");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}